

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_t1_encode(opj_tcd_t *p_tcd)

{
  opj_tcp_t *tcp;
  OPJ_BOOL OVar1;
  opj_t1_t *t1;
  opj_tcp_t *l_tcp;
  OPJ_FLOAT64 *pOStack_28;
  OPJ_UINT32 l_mct_numcomps;
  OPJ_FLOAT64 *l_mct_norms;
  opj_t1_t *l_t1;
  opj_tcd_t *p_tcd_local;
  
  tcp = p_tcd->tcp;
  t1 = opj_t1_create(1);
  if (t1 == (opj_t1_t *)0x0) {
    p_tcd_local._4_4_ = 0;
  }
  else {
    if (tcp->mct == 1) {
      l_tcp._4_4_ = 3;
      if (tcp->tccps->qmfbid == 0) {
        pOStack_28 = opj_mct_get_mct_norms_real();
      }
      else {
        pOStack_28 = opj_mct_get_mct_norms();
      }
    }
    else {
      l_tcp._4_4_ = p_tcd->image->numcomps;
      pOStack_28 = tcp->mct_norms;
    }
    OVar1 = opj_t1_encode_cblks(t1,p_tcd->tcd_image->tiles,tcp,pOStack_28,l_tcp._4_4_);
    if (OVar1 == 0) {
      opj_t1_destroy(t1);
      p_tcd_local._4_4_ = 0;
    }
    else {
      opj_t1_destroy(t1);
      p_tcd_local._4_4_ = 1;
    }
  }
  return p_tcd_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_tcd_t1_encode ( opj_tcd_t *p_tcd )
{
        opj_t1_t * l_t1;
        const OPJ_FLOAT64 * l_mct_norms;
        OPJ_UINT32 l_mct_numcomps = 0U;
        opj_tcp_t * l_tcp = p_tcd->tcp;

        l_t1 = opj_t1_create(OPJ_TRUE);
        if (l_t1 == 00) {
                return OPJ_FALSE;
        }

        if (l_tcp->mct == 1) {
                l_mct_numcomps = 3U;
                /* irreversible encoding */
                if (l_tcp->tccps->qmfbid == 0) {
                        l_mct_norms = opj_mct_get_mct_norms_real();
                }
                else {
                        l_mct_norms = opj_mct_get_mct_norms();
                }
        }
        else {
                l_mct_numcomps = p_tcd->image->numcomps;
                l_mct_norms = (const OPJ_FLOAT64 *) (l_tcp->mct_norms);
        }

        if (! opj_t1_encode_cblks(l_t1, p_tcd->tcd_image->tiles , l_tcp, l_mct_norms, l_mct_numcomps)) {
        opj_t1_destroy(l_t1);
                return OPJ_FALSE;
        }

        opj_t1_destroy(l_t1);

        return OPJ_TRUE;
}